

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSharedMemoryFileLockController::GetTransactionLock
          (CSharedMemoryFileLockController *this,CPalThread *pThread,
          FileTransactionLockType eLockType,DWORD dwOffsetLow,DWORD dwOffsetHigh,
          DWORD nNumberOfBytesToLockLow,DWORD nNumberOfBytesToLockHigh,
          IFileTransactionLock **ppTransactionLock)

{
  PAL_ERROR PVar1;
  CSharedMemoryFileTransactionLock *pCVar2;
  UINT64 lockRgnStart;
  UINT64 nbBytesToLock;
  
  lockRgnStart = CONCAT44(dwOffsetHigh,dwOffsetLow);
  nbBytesToLock = CONCAT44(nNumberOfBytesToLockHigh,nNumberOfBytesToLockLow);
  PVar1 = FILELockFileRegion(this->m_shmFileLocks,this,lockRgnStart,nbBytesToLock,RDWR_LOCK_RGN);
  if (PVar1 == 0) {
    pCVar2 = InternalNew<CorUnix::CSharedMemoryFileTransactionLock,unsigned_long,void*,unsigned_long,unsigned_long>
                       (this->m_shmFileLocks,this,lockRgnStart,nbBytesToLock);
    *ppTransactionLock = &pCVar2->super_IFileTransactionLock;
    PVar1 = 0;
    if (pCVar2 == (CSharedMemoryFileTransactionLock *)0x0) {
      FILEUnlockFileRegion(this->m_shmFileLocks,this,lockRgnStart,nbBytesToLock,RDWR_LOCK_RGN);
      PVar1 = 0xe;
    }
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CSharedMemoryFileLockController::GetTransactionLock(
    CPalThread *pThread,                // IN, OPTIONAL
    FileTransactionLockType eLockType,
    DWORD dwOffsetLow,
    DWORD dwOffsetHigh,
    DWORD nNumberOfBytesToLockLow,
    DWORD nNumberOfBytesToLockHigh,
    IFileTransactionLock **ppTransactionLock    // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    UINT64 lockRgnStart;
    UINT64 nbBytesToLock;

    lockRgnStart  = ((UINT64)dwOffsetHigh) << 32  | dwOffsetLow;
    nbBytesToLock = ((UINT64)nNumberOfBytesToLockHigh) << 32  | 
                             nNumberOfBytesToLockLow;

    palError = FILELockFileRegion(
        m_shmFileLocks,
        reinterpret_cast<PVOID>(this),
        lockRgnStart, 
        nbBytesToLock,
        RDWR_LOCK_RGN
        );

    if (NO_ERROR == palError)
    {
        *ppTransactionLock = InternalNew<CSharedMemoryFileTransactionLock>(m_shmFileLocks,
                                                                           reinterpret_cast<PVOID>(this),
                                                                           lockRgnStart, 
                                                                           nbBytesToLock);
        if (NULL == *ppTransactionLock)
        {
            palError = ERROR_OUTOFMEMORY;
            FILEUnlockFileRegion(
                m_shmFileLocks,
                reinterpret_cast<PVOID>(this),
                lockRgnStart, 
                nbBytesToLock,
                RDWR_LOCK_RGN
                );
        }
    }

    return palError;
}